

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shape-description.cpp
# Opt level: O0

int msdfgen::readCharS(char **input)

{
  char *pcVar1;
  bool bVar2;
  int c;
  char **input_local;
  
  do {
    pcVar1 = *input;
    *input = pcVar1 + 1;
    input_local._4_4_ = (int)*pcVar1;
    bVar2 = true;
    if (((input_local._4_4_ != 0x20) && (bVar2 = true, input_local._4_4_ != 9)) &&
       (bVar2 = true, input_local._4_4_ != 0xd)) {
      bVar2 = input_local._4_4_ == 10;
    }
  } while (bVar2);
  if (input_local._4_4_ == 0) {
    input_local._4_4_ = -1;
  }
  return input_local._4_4_;
}

Assistant:

int readCharS(const char **input) {
    int c = '\0';
    do {
        c = *(*input)++;
    } while (c == ' ' || c == '\t' || c == '\r' || c == '\n');
    if (!c) {
        --c;
        return EOF;
    }
    return c;
}